

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall r_comp::Preprocessor::Preprocessor(Preprocessor *this)

{
  shared_ptr<r_comp::RepliStruct> local_20;
  Preprocessor *local_10;
  Preprocessor *this_local;
  
  local_10 = this;
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&this->root);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>_>_>
  ::unordered_map(&this->m_templateClasses);
  std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_20);
  std::shared_ptr<r_comp::RepliStruct>::operator=(&this->root,&local_20);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_20);
  return;
}

Assistant:

Preprocessor::Preprocessor()
{
    root = std::make_shared<RepliStruct>(RepliStruct::Root);
}